

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue js_string_codePointRange(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  int *piVar1;
  int iVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  uint c;
  uint uVar7;
  JSValue JVar8;
  uint local_50;
  uint local_4c;
  StringBuffer b_s;
  int64_t iVar6;
  
  JVar8 = *argv;
  if (0xfffffff4 < (uint)argv->tag) {
    *(int *)(argv->u).ptr = *(argv->u).ptr + 1;
  }
  iVar2 = JS_ToInt32Free(ctx,(int32_t *)&local_4c,JVar8);
  iVar6 = 6;
  if (iVar2 == 0) {
    piVar1 = (int *)argv[1].u.ptr;
    JVar8 = argv[1];
    if (0xfffffff4 < (uint)argv[1].tag) {
      *piVar1 = *piVar1 + 1;
    }
    iVar2 = JS_ToInt32Free(ctx,(int32_t *)&local_50,JVar8);
    if (iVar2 == 0) {
      uVar7 = 0x110000;
      if (local_50 < 0x110000) {
        uVar7 = local_50;
      }
      c = uVar7;
      if (local_4c < uVar7) {
        c = local_4c;
      }
      b_s.size = uVar7 - c;
      if (0x10000 < local_50) {
        uVar4 = 0x10000;
        if (0x10000 < c) {
          uVar4 = c;
        }
        b_s.size = b_s.size + (uVar7 - uVar4);
      }
      b_s.len = 0;
      b_s.is_wide_char = (int)(0xff < local_50);
      b_s.error_status = 0;
      b_s.ctx = ctx;
      b_s.str = js_alloc_string(ctx,b_s.size,b_s.is_wide_char);
      if (b_s.str != (JSString *)0x0) {
        if (local_4c < uVar7) {
          do {
            string_buffer_putc(&b_s,c);
            c = c + 1;
          } while (uVar7 != c);
        }
        JVar8 = string_buffer_end(&b_s);
        iVar6 = JVar8.tag;
        uVar5 = (ulong)JVar8.u.ptr & 0xffffffff00000000;
        uVar3 = (ulong)JVar8.u._0_4_;
        goto LAB_0010d26c;
      }
    }
  }
  uVar3 = 0;
  uVar5 = 0;
LAB_0010d26c:
  JVar8.u.ptr = (void *)(uVar3 | uVar5);
  JVar8.tag = iVar6;
  return JVar8;
}

Assistant:

JSValue js_string_codePointRange(JSContext *ctx, JSValueConst this_val,
                                 int argc, JSValueConst *argv)
{
    uint32_t start, end, i, n;
    StringBuffer b_s, *b = &b_s;

    if (JS_ToUint32(ctx, &start, argv[0]) ||
        JS_ToUint32(ctx, &end, argv[1]))
        return JS_EXCEPTION;
    end = min_uint32(end, 0x10ffff + 1);

    if (start > end) {
        start = end;
    }
    n = end - start;
    if (end > 0x10000) {
        n += end - max_uint32(start, 0x10000);
    }
    if (string_buffer_init2(ctx, b, n, end >= 0x100))
        return JS_EXCEPTION;
    for(i = start; i < end; i++) {
        string_buffer_putc(b, i);
    }
    return string_buffer_end(b);
}